

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::InitProtobufDefaults(void)

{
  int iVar1;
  
  if (InitProtobufDefaults()::is_inited == '\0') {
    iVar1 = __cxa_guard_acquire(&InitProtobufDefaults()::is_inited);
    if (iVar1 != 0) {
      fixed_address_empty_string_abi_cxx11_ = &DAT_003d2ba8;
      DAT_003d2ba0 = 0;
      DAT_003d2ba8 = 0;
      OnShutdownRun(DestroyString,&fixed_address_empty_string_abi_cxx11_);
      __cxa_guard_release(&InitProtobufDefaults()::is_inited);
      return;
    }
  }
  return;
}

Assistant:

void InitProtobufDefaults() {
  static bool is_inited = InitProtobufDefaultsImpl();
  (void)is_inited;
}